

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Scope * scope_D_Scope(D_Scope *current,D_Scope *scope)

{
  D_Scope *pDVar1;
  D_Scope *__s;
  D_Scope *parent;
  D_Scope *st;
  D_Scope *scope_local;
  D_Scope *current_local;
  
  __s = (D_Scope *)malloc(0x50);
  pDVar1 = current->up;
  memset(__s,0,0x50);
  __s->depth = current->depth;
  __s->up = pDVar1;
  *(byte *)__s = *(byte *)__s & 0xfc | *(byte *)current & 3;
  __s->search = current;
  __s->dynamic = scope;
  __s->up_updates = current;
  __s->down_next = current->down;
  current->down = __s;
  return __s;
}

Assistant:

D_Scope *scope_D_Scope(D_Scope *current, D_Scope *scope) {
  D_Scope *st = MALLOC(sizeof(D_Scope)), *parent = current->up;
  memset(st, 0, sizeof(D_Scope));
  st->depth = current->depth;
  st->up = parent;
  st->kind = current->kind;
  st->search = current;
  st->dynamic = scope;
  st->up_updates = current;
  st->down_next = current->down;
  current->down = st;
  return st;
}